

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

uint __thiscall
ON_OutlineFigure::GetPolyline
          (ON_OutlineFigure *this,double tolerance,
          _func_void_float_float_void_ptr *PointCallbackFunc,void *context)

{
  ON_OutlineFigurePoint *pOVar1;
  uint uVar2;
  ON_OutlineFigurePoint *pOVar3;
  int order;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  double dVar7;
  ON_2fPoint bez_cv [4];
  Internal_OutlineFigureToPolyline tp;
  ON_2fPoint local_78;
  ON_2fPoint local_70;
  ON_2fPoint local_68;
  ON_2fPoint local_60;
  Internal_OutlineFigureToPolyline local_58;
  
  local_58.m_point_count = 0;
  if (PointCallbackFunc != (_func_void_float_float_void_ptr *)0x0) {
    pOVar3 = (this->m_points).m_a;
    uVar2 = (this->m_points).m_count;
    if (uVar2 != 0 && pOVar3 != (ON_OutlineFigurePoint *)0x0) {
      local_58.m_prev_point = ON_2fPoint::NanPoint;
      local_58.m_point_count = 0;
      if (this->m_units_per_em == 0) {
        dVar7 = 1.0;
      }
      else {
        dVar7 = (double)this->m_units_per_em * 0.0009765625;
      }
      local_58.m_2x_tolerance =
           (double)(-(ulong)(0.0 < tolerance) & (ulong)tolerance |
                   ~-(ulong)(0.0 < tolerance) & (ulong)dVar7);
      local_58.m_2x_tolerance = local_58.m_2x_tolerance + local_58.m_2x_tolerance;
      uVar5 = 0;
      local_58.m_PointCallbackFunc = PointCallbackFunc;
      local_58.m_context = context;
      do {
        uVar4 = (uint)uVar5;
        if (local_58.m_point_count == 0) {
LAB_00496d1f:
          Internal_OutlineFigureToPolyline::AddPoint(&local_58,pOVar3[uVar5].m_point);
        }
        else {
          pOVar1 = pOVar3 + uVar5;
          if (pOVar1->m_point_type == CubicBezierPoint) {
            uVar6 = uVar4 + 2;
            if (((uVar2 <= uVar6) || (pOVar3[uVar4 + 1].m_point_type != CubicBezierPoint)) ||
               (pOVar3[uVar6].m_point_type != CubicBezierPoint)) goto LAB_00496d1f;
            local_70 = pOVar1->m_point;
            local_68 = pOVar3[uVar4 + 1].m_point;
            local_60 = pOVar3[uVar6].m_point;
            order = 4;
          }
          else {
            if (((pOVar1->m_point_type != QuadraticBezierPoint) ||
                (uVar6 = uVar4 + 1, uVar2 <= uVar6)) ||
               (pOVar3[uVar6].m_point_type != QuadraticBezierPoint)) goto LAB_00496d1f;
            local_70 = pOVar1->m_point;
            local_68 = pOVar3[uVar6].m_point;
            order = 3;
          }
          local_78 = local_58.m_prev_point;
          Internal_OutlineFigureToPolyline::Internal_AddBezier(&local_58,0,order,&local_78);
          uVar4 = uVar6;
        }
        uVar5 = (ulong)(uVar4 + 1);
      } while (uVar4 + 1 < uVar2);
    }
  }
  return local_58.m_point_count;
}

Assistant:

unsigned int ON_OutlineFigure::GetPolyline(
  double tolerance, 
  void(* PointCallbackFunc)(float x, float y, void *), 
  void * context
) const
{
  if (nullptr == PointCallbackFunc)
    return 0;

  const ON_OutlineFigurePoint* a = m_points.Array();
  const unsigned int c = m_points.UnsignedCount();
  if (nullptr == a || c <= 0)
    return 0;
  
  Internal_OutlineFigureToPolyline tp;
  tp.m_PointCallbackFunc = PointCallbackFunc;
  tp.m_context = context;

  const double default_tolerance = DefaultPolylineTolerance();

  tp.m_2x_tolerance = 2.0*((tolerance > 0.0) ? tolerance : default_tolerance);

  ON_2fPoint bez_cv[4];

  for (unsigned int i = 0; i < c; i++)
  {
    if (tp.m_point_count > 0)
    {
      if (
        ON_OutlineFigurePoint::Type::QuadraticBezierPoint == a[i].m_point_type
        && i + 1 < c
        && ON_OutlineFigurePoint::Type::QuadraticBezierPoint == a[i + 1].m_point_type
        )
      {
        bez_cv[0] = tp.m_prev_point;
        bez_cv[1] = a[i++].m_point;
        bez_cv[2] = a[i].m_point;
        tp.AddQuadraticBezier(bez_cv);
        continue;
      }

      if (
        ON_OutlineFigurePoint::Type::CubicBezierPoint == a[i].m_point_type
        && i + 2 < c
        && ON_OutlineFigurePoint::Type::CubicBezierPoint == a[i + 1].m_point_type
        && ON_OutlineFigurePoint::Type::CubicBezierPoint == a[i + 2].m_point_type
        )
      {
        bez_cv[0] = tp.m_prev_point;
        bez_cv[1] = a[i++].m_point;
        bez_cv[2] = a[i++].m_point;
        bez_cv[3] = a[i].m_point;
        tp.AddCubicBezier(bez_cv);
        continue;
      }
    }

    tp.AddPoint(a[i].m_point);
  }

  return tp.m_point_count;
}